

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.h
# Opt level: O1

void __thiscall merlin::factor::factor(factor *this,variable_set *vs,value s)

{
  pointer pdVar1;
  long lVar2;
  pointer pdVar3;
  long lVar4;
  long lVar5;
  
  this->_vptr_factor = (_func_int **)&PTR__factor_0018f9b0;
  variable_set::variable_set(&this->v_,vs);
  (this->t_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->t_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->t_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->c_ = -1;
  lVar2 = (long)(vs->m_v).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(vs->m_v).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (lVar2 == 0) {
    lVar5 = 1;
  }
  else {
    lVar2 = lVar2 >> 3;
    lVar5 = 1;
    lVar4 = 0;
    do {
      lVar5 = lVar5 * vs->m_d[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar2 + (ulong)(lVar2 == 0) != lVar4);
  }
  std::vector<double,_std::allocator<double>_>::resize(&this->t_,lVar5 + (ulong)(lVar5 == 0));
  pdVar1 = (this->t_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pdVar3 = (this->t_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start; pdVar3 != pdVar1; pdVar3 = pdVar3 + 1) {
    *pdVar3 = s;
  }
  return;
}

Assistant:

factor(variable_set const& vs, value s = 1.0) : v_(vs), t_(), c_(-1) {
		t_.resize(vs.num_states());
		set_dims();
		fill(s);
	}